

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O0

int vector_resize(vector v,size_t size)

{
  int iVar1;
  ulong in_RSI;
  size_t in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI == 0) {
    iVar1 = 1;
  }
  else if ((*(ulong *)(in_RDI + 8) < in_RSI) &&
          (iVar1 = vector_reserve((vector)CONCAT44(in_stack_fffffffffffffffc,
                                                   in_stack_fffffffffffffff8),in_RDI), iVar1 != 0))
  {
    log_write_impl_va("metacall",0xc1,"vector_resize",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                      ,3,"Vector reserve error");
    iVar1 = 1;
  }
  else {
    *(ulong *)(in_RDI + 0x10) = in_RSI;
    if (*(ulong *)(in_RDI + 0x10) < *(ulong *)(in_RDI + 8) >> 3) {
      iVar1 = vector_reserve((vector)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             in_RDI);
    }
    else {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int vector_resize(vector v, size_t size)
{
	if (v != NULL)
	{
		if (v->capacity < size)
		{
			if (vector_reserve(v, size) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");

				return 1;
			}
		}

		v->size = size;

		if (v->size < v->capacity / VECTOR_CAPACITY_MIN_USED)
		{
			return vector_reserve(v, v->size * VECTOR_CAPACITY_INCREMENT);
		}

		return 0;
	}

	return 1;
}